

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_notation.cpp
# Opt level: O3

ScientificNotation __thiscall
icu_63::number::ScientificNotation::withMinExponentDigits
          (ScientificNotation *this,int32_t minExponentDigits)

{
  undefined4 uVar1;
  UNumberSignDisplay in_EDX;
  ScientificNotation SVar2;
  uint uStack_c;
  
  if (minExponentDigits - 1U < 999) {
    in_EDX = (this->super_Notation).fUnion.scientific.fExponentSignDisplay;
    uStack_c = minExponentDigits << 0x10 | (uint)*(ushort *)&(this->super_Notation).fUnion;
    uVar1 = 0;
  }
  else {
    uStack_c = 0x10112;
    uVar1 = 3;
  }
  SVar2.super_Notation.fUnion.compactStyle = uStack_c;
  SVar2.super_Notation.fType = uVar1;
  SVar2.super_Notation.fUnion.scientific.fExponentSignDisplay = in_EDX;
  return (ScientificNotation)SVar2.super_Notation;
}

Assistant:

ScientificNotation
ScientificNotation::withMinExponentDigits(int32_t minExponentDigits) const {
    if (minExponentDigits >= 1 && minExponentDigits <= kMaxIntFracSig) {
        ScientificSettings settings = fUnion.scientific;
        settings.fMinExponentDigits = static_cast<digits_t>(minExponentDigits);
        NotationUnion union_ = {settings};
        return {NTN_SCIENTIFIC, union_};
    } else {
        return {U_NUMBER_ARG_OUTOFBOUNDS_ERROR};
    }
}